

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_extension.cpp
# Opt level: O0

BoundStatement * __thiscall duckdb::Binder::Bind(Binder *this,ExtensionStatement *stmt)

{
  code *pcVar1;
  undefined8 uVar2;
  ParserExtensionInfo *pPVar3;
  StatementProperties *pSVar4;
  LogicalGet *this_00;
  size_type sVar5;
  long in_RDX;
  long in_RSI;
  LogicalOperator *in_RDI;
  idx_t i;
  LogicalGet *get;
  StatementProperties *properties;
  ParserExtensionPlanResult parse_result;
  BoundStatement *result;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>_>
  *in_stack_fffffffffffffd18;
  ulong column_id;
  Binder *in_stack_fffffffffffffd20;
  LogicalGet *this_01;
  ulong local_280;
  undefined1 local_248 [24];
  undefined1 local_230 [264];
  vector<duckdb::Value,_true> *in_stack_fffffffffffffed8;
  TableFunction *in_stack_fffffffffffffee0;
  Binder *in_stack_fffffffffffffee8;
  byte local_28;
  StatementReturnType local_27;
  
  BoundStatement::BoundStatement((BoundStatement *)in_stack_fffffffffffffd20);
  pcVar1 = *(code **)(in_RDX + 0x80);
  pPVar3 = shared_ptr<duckdb::ParserExtensionInfo,_true>::get
                     ((shared_ptr<duckdb::ParserExtensionInfo,_true> *)0xddf246);
  uVar2 = *(undefined8 *)(in_RSI + 0x10);
  unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>,_true>
  ::unique_ptr((unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>,_true>
                *)in_stack_fffffffffffffd20,
               (unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>,_true>
                *)in_stack_fffffffffffffd18);
  (*pcVar1)(local_230,pPVar3,uVar2,local_248);
  unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>,_true>
                 *)0xddf2a9);
  pSVar4 = GetStatementProperties(in_stack_fffffffffffffd20);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>_>
  ::operator=((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>_>
               *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  pSVar4->requires_valid_transaction = (bool)(local_28 & 1);
  pSVar4->return_type = local_27;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffd20,
             (vector<duckdb::Value,_true> *)in_stack_fffffffffffffd18);
  BindTableFunction(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::operator=
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd20,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd18);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0xddf362);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0xddf36c);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd20);
  this_00 = LogicalOperator::Cast<duckdb::LogicalGet>(in_RDI);
  this_01 = this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)this_00,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffd18);
  vector<duckdb::LogicalType,_true>::operator=
            ((vector<duckdb::LogicalType,_true> *)this_01,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd18);
  LogicalGet::ClearColumnIds((LogicalGet *)0xddf3da);
  local_280 = 0;
  while (column_id = local_280,
        sVar5 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                          (&(this_00->returned_types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
        , column_id < sVar5) {
    LogicalGet::AddColumnId(this_01,column_id);
    local_280 = local_280 + 1;
  }
  ParserExtensionPlanResult::~ParserExtensionPlanResult((ParserExtensionPlanResult *)this_01);
  return (BoundStatement *)in_RDI;
}

Assistant:

BoundStatement Binder::Bind(ExtensionStatement &stmt) {
	BoundStatement result;

	// perform the planning of the function
	D_ASSERT(stmt.extension.plan_function);
	auto parse_result =
	    stmt.extension.plan_function(stmt.extension.parser_info.get(), context, std::move(stmt.parse_data));

	auto &properties = GetStatementProperties();
	properties.modified_databases = parse_result.modified_databases;
	properties.requires_valid_transaction = parse_result.requires_valid_transaction;
	properties.return_type = parse_result.return_type;

	// create the plan as a scan of the given table function
	result.plan = BindTableFunction(parse_result.function, std::move(parse_result.parameters));
	D_ASSERT(result.plan->type == LogicalOperatorType::LOGICAL_GET);
	auto &get = result.plan->Cast<LogicalGet>();
	result.names = get.names;
	result.types = get.returned_types;
	get.ClearColumnIds();
	for (idx_t i = 0; i < get.returned_types.size(); i++) {
		get.AddColumnId(i);
	}
	return result;
}